

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O3

void connect_and_get_status(int ServerPort)

{
  CManager p_Var1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  Remote_evpath_state ev_state;
  undefined4 local_94;
  Remote_evpath_state local_90;
  
  p_Var1 = (CManager)CManager_create();
  uVar2 = create_attr_list();
  uVar3 = attr_atom_from_string("IP_HOST");
  uVar4 = attr_atom_from_string("IP_PORT");
  add_attr(uVar2,uVar3,3,"localhost");
  add_attr(uVar2,uVar4,1,(long)ServerPort);
  lVar5 = CMinitiate_conn(p_Var1,uVar2);
  if (lVar5 == 0) {
    return;
  }
  local_90.cm = p_Var1;
  adios2::EVPathRemoteCommon::RegisterFormats(&local_90);
  ServerRegisterHandlers(&local_90);
  local_94 = CMCondition_get(local_90.cm,lVar5);
  CMwrite(lVar5,local_90.StatusServerFormat,&local_94);
  CMCondition_wait(local_90.cm,local_94);
  exit(0);
}

Assistant:

void connect_and_get_status(int ServerPort)
{
    CManager cm = CManager_create();
    _StatusServerMsg status_msg;
    struct Remote_evpath_state ev_state;
    attr_list contact_list = create_attr_list();
    atom_t CM_IP_PORT = -1;
    atom_t CM_IP_HOSTNAME = -1;
    CM_IP_HOSTNAME = attr_atom_from_string("IP_HOST");
    CM_IP_PORT = attr_atom_from_string("IP_PORT");
    add_attr(contact_list, CM_IP_HOSTNAME, Attr_String, (attr_value)hostname);
    add_attr(contact_list, CM_IP_PORT, Attr_Int4, (attr_value)ServerPort);
    CMConnection conn = CMinitiate_conn(cm, contact_list);
    if (!conn)
        return;

    ev_state.cm = cm;

    RegisterFormats(ev_state);

    ServerRegisterHandlers(ev_state);

    memset(&status_msg, 0, sizeof(status_msg));
    status_msg.StatusResponseCondition = CMCondition_get(ev_state.cm, conn);
    CMwrite(conn, ev_state.StatusServerFormat, &status_msg);
    CMCondition_wait(ev_state.cm, status_msg.StatusResponseCondition);
    exit(0);
}